

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# large.c
# Opt level: O2

void * duckdb_je_large_ralloc
                 (tsdn_t *tsdn,arena_t *arena,void *ptr,size_t usize,size_t alignment,_Bool zero,
                 tcache_t *tcache,hook_ralloc_args_t *hook_args)

{
  ulong old_usize;
  rtree_ctx_t *rtree_ctx;
  edata_t *peVar1;
  _Bool _Var2;
  uint uVar3;
  void *result;
  void **ppvVar4;
  cache_bin_t *bin;
  cache_bin_t *cache_bin;
  rtree_t *prVar5;
  uintptr_t key;
  size_t sVar6;
  rtree_contents_t local_1c8;
  rtree_ctx_t rtree_ctx_fallback;
  
  sVar6 = alignment;
  if (tsdn == (tsdn_t *)0x0) {
    prVar5 = (rtree_t *)&rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar5);
  }
  else {
    prVar5 = (rtree_t *)&(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx
    ;
  }
  rtree_read(&local_1c8,tsdn,prVar5,(rtree_ctx_t *)ptr,sVar6);
  peVar1 = local_1c8.edata;
  old_usize = *(ulong *)((long)duckdb_je_sz_index2size_tab +
                        (ulong)((uint)(local_1c8.edata)->e_bits >> 0x11 & 0x7f8));
  key = (uintptr_t)zero;
  _Var2 = duckdb_je_large_ralloc_no_move(tsdn,local_1c8.edata,usize,usize,zero);
  if (!_Var2) {
    duckdb_je_hook_invoke_expand
              (hook_args->is_realloc ^ hook_expand_rallocx,ptr,old_usize,usize,(uintptr_t)ptr,
               hook_args->args);
    return peVar1->e_addr;
  }
  if (alignment < 0x41) {
    result = duckdb_je_large_malloc(tsdn,arena,usize,zero);
  }
  else {
    key = (uintptr_t)zero;
    result = duckdb_je_large_palloc(tsdn,arena,usize,alignment,zero);
  }
  if (result == (void *)0x0) {
    return (void *)0x0;
  }
  duckdb_je_hook_invoke_alloc
            (hook_args->is_realloc ^ hook_alloc_rallocx,result,(uintptr_t)result,hook_args->args);
  duckdb_je_hook_invoke_dalloc(hook_dalloc_rallocx - hook_args->is_realloc,ptr,hook_args->args);
  if (old_usize < usize) {
    usize = old_usize;
  }
  switchD_016b45db::default(result,peVar1->e_addr,usize);
  rtree_ctx = (rtree_ctx_t *)peVar1->e_addr;
  if (tcache == (tcache_t *)0x0) {
    if (old_usize < 0x1001) {
      uVar3 = (uint)duckdb_je_sz_size2index_tab[old_usize + 7 >> 3];
    }
    else {
      uVar3 = sz_size2index_compute(old_usize);
    }
    if (0x23 < uVar3) {
      if (tsdn == (tsdn_t *)0x0) {
        prVar5 = (rtree_t *)&rtree_ctx_fallback;
        duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar5);
      }
      else {
        prVar5 = (rtree_t *)
                 &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      rtree_read(&local_1c8,tsdn,prVar5,rtree_ctx,key);
      goto LAB_01fa4bce;
    }
  }
  else {
    if (old_usize < 0x1001) {
      uVar3 = (uint)duckdb_je_sz_size2index_tab[old_usize + 7 >> 3];
    }
    else {
      uVar3 = sz_size2index_compute(old_usize);
    }
    if (0x23 < uVar3) {
      if (uVar3 < tcache->tcache_slow->tcache_nbins) {
        ppvVar4 = tcache->bins[uVar3].stack_head;
        if (ppvVar4 != (void **)&duckdb_je_disabled_bin) {
          cache_bin = tcache->bins + uVar3;
          if (tcache->bins[uVar3].low_bits_full == (uint16_t)ppvVar4) {
            duckdb_je_tcache_bin_flush_large
                      (&tsdn->tsd,tcache,cache_bin,uVar3,
                       (uint)(tcache->bins[uVar3].bin_info.ncached_max >>
                             ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
            goto LAB_01fa4b85;
          }
          goto LAB_01fa4a7e;
        }
      }
      if (tsdn == (tsdn_t *)0x0) {
        prVar5 = (rtree_t *)&rtree_ctx_fallback;
        duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar5);
      }
      else {
        prVar5 = (rtree_t *)
                 &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      rtree_read(&local_1c8,tsdn,prVar5,rtree_ctx,key);
LAB_01fa4bce:
      duckdb_je_large_dalloc(tsdn,local_1c8.edata);
      return result;
    }
    cache_bin = tcache->bins + uVar3;
    ppvVar4 = cache_bin->stack_head;
    if (tcache->bins[uVar3].low_bits_full != (uint16_t)ppvVar4) {
LAB_01fa4a7e:
      cache_bin->stack_head = ppvVar4 + -1;
      ppvVar4[-1] = rtree_ctx;
      return result;
    }
    if (ppvVar4 != (void **)&duckdb_je_disabled_bin) {
      duckdb_je_tcache_bin_flush_small
                (&tsdn->tsd,tcache,cache_bin,uVar3,
                 (uint)(tcache->bins[uVar3].bin_info.ncached_max >>
                       ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_01fa4b85:
      ppvVar4 = cache_bin->stack_head;
      if (cache_bin->low_bits_full == (uint16_t)ppvVar4) {
        return result;
      }
      cache_bin->stack_head = ppvVar4 + -1;
      ppvVar4[-1] = rtree_ctx;
      return result;
    }
  }
  duckdb_je_arena_dalloc_small(tsdn,rtree_ctx);
  return result;
}

Assistant:

void *
large_ralloc(tsdn_t *tsdn, arena_t *arena, void *ptr, size_t usize,
    size_t alignment, bool zero, tcache_t *tcache,
    hook_ralloc_args_t *hook_args) {
	edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global, ptr);

	size_t oldusize = edata_usize_get(edata);
	/* The following should have been caught by callers. */
	assert(usize > 0 && usize <= SC_LARGE_MAXCLASS);
	/* Both allocation sizes must be large to avoid a move. */
	assert(oldusize >= SC_LARGE_MINCLASS
	    && usize >= SC_LARGE_MINCLASS);

	/* Try to avoid moving the allocation. */
	if (!large_ralloc_no_move(tsdn, edata, usize, usize, zero)) {
		hook_invoke_expand(hook_args->is_realloc
		    ? hook_expand_realloc : hook_expand_rallocx, ptr, oldusize,
		    usize, (uintptr_t)ptr, hook_args->args);
		return edata_addr_get(edata);
	}

	/*
	 * usize and old size are different enough that we need to use a
	 * different size class.  In that case, fall back to allocating new
	 * space and copying.
	 */
	void *ret = large_ralloc_move_helper(tsdn, arena, usize, alignment,
	    zero);
	if (ret == NULL) {
		return NULL;
	}

	hook_invoke_alloc(hook_args->is_realloc
	    ? hook_alloc_realloc : hook_alloc_rallocx, ret, (uintptr_t)ret,
	    hook_args->args);
	hook_invoke_dalloc(hook_args->is_realloc
	    ? hook_dalloc_realloc : hook_dalloc_rallocx, ptr, hook_args->args);

	size_t copysize = (usize < oldusize) ? usize : oldusize;
	memcpy(ret, edata_addr_get(edata), copysize);
	isdalloct(tsdn, edata_addr_get(edata), oldusize, tcache, NULL, true);
	return ret;
}